

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatFile.cpp
# Opt level: O2

int __thiscall DatUnpacker::DatFile::size(DatFile *this)

{
  char cVar1;
  uint position;
  int iVar2;
  
  position = DatFile::position(this);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::istream::seekg((long)&this->_ifstream,_S_beg);
  }
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::ostream::seekp((long)&this->_ofstream,_S_beg);
  }
  iVar2 = DatFile::position(this);
  setPosition(this,position);
  return iVar2;
}

Assistant:

int DatFile::size()
    {
        int oldPosition = position();

        if (_ifstream.is_open())
        {
            _ifstream.seekg(0, std::ios::end);
        }

        if (_ofstream.is_open())
        {
            _ofstream.seekp(0, std::ios::end);
        }

        int value = position();
        setPosition(oldPosition);
        return value;
    }